

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_ge_scalarmult_small_precomp(ge_p3 *h,uint8_t *a,uint8_t *precomp_table)

{
  byte bVar1;
  uint uVar2;
  fe_limb_t *out;
  long lVar3;
  ge_precomp *u;
  ulong uVar4;
  ge_precomp e;
  fe y;
  fe x;
  ge_precomp multiples [15];
  
  for (lVar3 = 0; lVar3 != 0x708; lVar3 = lVar3 + 0x78) {
    fe_frombytes_strict(&x,precomp_table);
    fe_frombytes_strict(&y,precomp_table + 0x20);
    fe_add((fe_loose *)((long)multiples[0].yplusx.v + lVar3),&y,&x);
    fe_sub((fe_loose *)((long)multiples[0].yminusx.v + lVar3),&y,&x);
    out = (fe_limb_t *)((long)multiples[0].xy2d.v + lVar3);
    fe_mul_impl(out,x.v,y.v);
    fe_mul_impl(out,out,d2.v);
    precomp_table = precomp_table + 0x40;
  }
  (h->X).v[4] = 0;
  (h->X).v[2] = 0;
  (h->X).v[3] = 0;
  (h->X).v[0] = 0;
  (h->X).v[1] = 0;
  (h->Y).v[1] = 0;
  (h->Y).v[2] = 0;
  (h->Y).v[3] = 0;
  (h->Y).v[4] = 0;
  (h->Y).v[0] = 1;
  (h->Z).v[1] = 0;
  (h->Z).v[2] = 0;
  (h->Z).v[3] = 0;
  (h->Z).v[4] = 0;
  (h->Z).v[0] = 1;
  (h->T).v[4] = 0;
  (h->T).v[0] = 0;
  (h->T).v[1] = 0;
  (h->T).v[2] = 0;
  (h->T).v[3] = 0;
  uVar4 = 0x3f;
  while (uVar2 = (uint)uVar4, uVar2 < 0x40) {
    bVar1 = 0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      bVar1 = bVar1 | ((a[lVar3 * 8 + (uVar4 >> 3)] >> (uVar2 & 7) & 1) != 0) <<
                      ((byte)lVar3 & 0x1f);
    }
    e.yplusx.v[3] = 0;
    e.yplusx.v[4] = 0;
    e.yplusx.v[1] = 0;
    e.yplusx.v[2] = 0;
    e.yplusx.v[0] = 1;
    e.yminusx.v[3] = 0;
    e.yminusx.v[4] = 0;
    e.yminusx.v[1] = 0;
    e.yminusx.v[2] = 0;
    e.yminusx.v[0] = 1;
    e.xy2d.v[2] = 0;
    e.xy2d.v[3] = 0;
    e.xy2d.v[0] = 0;
    e.xy2d.v[1] = 0;
    e.xy2d.v[4] = 0;
    u = multiples;
    for (uVar4 = 1; uVar4 != 0x10; uVar4 = uVar4 + 1) {
      cmov(&e,u,(byte)((byte)((uVar4 ^ (long)(char)bVar1) - 1 >> 0x38) & ~((char)bVar1 >> 7)) >> 7);
      u = u + 1;
    }
    x25519_ge_p3_to_cached((ge_cached *)&x,h);
    x25519_ge_add((ge_p1p1 *)&y,h,(ge_cached *)&x);
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)&y);
    ge_madd((ge_p1p1 *)&y,h,&e);
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)&y);
    uVar4 = (ulong)(uVar2 - 1);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_small_precomp(
    ge_p3 *h, const uint8_t a[32], const uint8_t precomp_table[15 * 2 * 32]) {
  // precomp_table is first expanded into matching |ge_precomp|
  // elements.
  ge_precomp multiples[15];

  unsigned i;
  for (i = 0; i < 15; i++) {
    // The precomputed table is assumed to already clear the top bit, so
    // |fe_frombytes_strict| may be used directly.
    const uint8_t *bytes = &precomp_table[i * (2 * 32)];
    fe x, y;
    fe_frombytes_strict(&x, bytes);
    fe_frombytes_strict(&y, bytes + 32);

    ge_precomp *out = &multiples[i];
    fe_add(&out->yplusx, &y, &x);
    fe_sub(&out->yminusx, &y, &x);
    fe_mul_ltt(&out->xy2d, &x, &y);
    fe_mul_llt(&out->xy2d, &out->xy2d, &d2);
  }

  // See the comment above |k25519SmallPrecomp| about the structure of the
  // precomputed elements. This loop does 64 additions and 64 doublings to
  // calculate the result.
  ge_p3_0(h);

  for (i = 63; i < 64; i--) {
    unsigned j;
    signed char index = 0;

    for (j = 0; j < 4; j++) {
      const uint8_t bit = 1 & (a[(8 * j) + (i / 8)] >> (i & 7));
      index |= (bit << j);
    }

    ge_precomp e;
    ge_precomp_0(&e);

    for (j = 1; j < 16; j++) {
      cmov(&e, &multiples[j - 1], 1 & constant_time_eq_w(index, j));
    }

    ge_cached cached;
    ge_p1p1 r;
    x25519_ge_p3_to_cached(&cached, h);
    x25519_ge_add(&r, h, &cached);
    x25519_ge_p1p1_to_p3(h, &r);

    ge_madd(&r, h, &e);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}